

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

int __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::dimension
          (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *this,Siblings *curr_sib)

{
  int dim;
  int iVar1;
  
  iVar1 = -1;
  for (; curr_sib != (Siblings *)0x0; curr_sib = curr_sib->oncles_) {
    iVar1 = iVar1 + 1;
  }
  return iVar1;
}

Assistant:

int dimension(Siblings const* curr_sib) const {
    int dim = -1;
    while (curr_sib != nullptr) {
      ++dim;
      curr_sib = curr_sib->oncles();
    }
    return dim;
  }